

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompilerRequirementFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  pointer pbVar1;
  cmake *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  cmMakefile *pcVar6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar7;
  mapped_type *pmVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __rhs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  string *i;
  pointer pbVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  allocator<char> local_289;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string type;
  char *defaultStd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  _Base_ptr local_1f0;
  string standard;
  string extProp;
  string stdProp;
  
  if (lang->_M_string_length == 0) {
    return;
  }
  pcVar6 = this->Makefile;
  std::operator+(&extProp,"CMAKE_",lang);
  std::operator+(&standard,&extProp,"_STANDARD_DEFAULT");
  pcVar5 = cmMakefile::GetDefinition(pcVar6,&standard);
  std::__cxx11::string::~string((string *)&standard);
  std::__cxx11::string::~string((string *)&extProp);
  if (pcVar5 == (char *)0x0) {
    return;
  }
  if (*pcVar5 == '\0') {
    return;
  }
  defaultStd = pcVar5;
  std::operator+(&extProp,lang,"_EXTENSIONS");
  pcVar5 = cmGeneratorTarget::GetProperty(target,&extProp);
  if (pcVar5 == (char *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = cmSystemTools::IsOff(pcVar5);
    bVar2 = !bVar2;
  }
  std::operator+(&stdProp,lang,"_STANDARD");
  pcVar5 = cmGeneratorTarget::GetProperty(target,&stdProp);
  if (pcVar5 == (char *)0x0) {
    if (!bVar2) goto LAB_001d815a;
    std::operator+(&type,"CMAKE_",lang);
    std::operator+(&standard,&type,"_EXTENSION_COMPILE_OPTION");
    std::__cxx11::string::~string((string *)&type);
    pcVar6 = cmTarget::GetMakefile(target->Target);
    pcVar5 = cmMakefile::GetDefinition(pcVar6,&standard);
    if (pcVar5 != (char *)0x0) {
      optVec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      optVec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      optVec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,pcVar5,(allocator<char> *)&optVec_1);
      cmSystemTools::ExpandListArgument(&type,&optVec,false);
      std::__cxx11::string::~string((string *)&type);
      pbVar1 = optVec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = optVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
          pbVar13 = pbVar13 + 1) {
        (*this->_vptr_cmLocalGenerator[8])(this,flags,pbVar13);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&optVec);
    }
    psVar11 = &standard;
  }
  else {
    pcVar12 = "STANDARD";
    if (bVar2) {
      pcVar12 = "EXTENSION";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,pcVar12,(allocator<char> *)&standard);
    std::operator+(&standard,lang,"_STANDARD_REQUIRED");
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&standard);
    std::__cxx11::string::~string((string *)&standard);
    if (bVar3) {
      std::operator+(&local_258,"CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_3,
                     &local_258,pcVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_3,
                     "_");
      std::operator+(&standard,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec_1,
                     &type);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec,
                     &standard,"_COMPILE_OPTION");
      std::__cxx11::string::~string((string *)&standard);
      std::__cxx11::string::~string((string *)&optVec_1);
      std::__cxx11::string::~string((string *)&optVec_3);
      std::__cxx11::string::~string((string *)&local_258);
      pcVar6 = cmTarget::GetMakefile(target->Target);
      pcVar12 = cmMakefile::GetDefinition(pcVar6,(string *)&optVec);
      if (pcVar12 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&standard);
        poVar10 = std::operator<<((ostream *)&standard,"Target \"");
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar10 = std::operator<<(poVar10,(string *)psVar11);
        poVar10 = std::operator<<(poVar10,"\" requires the language dialect \"");
        poVar10 = std::operator<<(poVar10,(string *)lang);
        poVar10 = std::operator<<(poVar10,pcVar5);
        poVar10 = std::operator<<(poVar10,"\" ");
        pcVar5 = "";
        if (bVar2) {
          pcVar5 = "(with compiler extensions)";
        }
        poVar10 = std::operator<<(poVar10,pcVar5);
        std::operator<<(poVar10,", but CMake does not know the compile flags to use to enable it.");
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,(string *)&optVec_1);
        std::__cxx11::string::~string((string *)&optVec_1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&standard);
      }
      else {
        optVec_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        optVec_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        optVec_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,pcVar12,(allocator<char> *)&optVec_3);
        cmSystemTools::ExpandListArgument(&standard,&optVec_1,false);
        std::__cxx11::string::~string((string *)&standard);
        pbVar1 = optVec_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar13 = optVec_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
            pbVar13 = pbVar13 + 1) {
          (*this->_vptr_cmLocalGenerator[8])(this,flags,pbVar13);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&optVec_1);
      }
      psVar11 = (string *)&optVec;
    }
    else {
      if ((AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
           ::langStdMap_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                       ::langStdMap_abi_cxx11_), iVar4 != 0)) {
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
              ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
              ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
        ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::~map,&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_);
      }
      if (AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
          ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CXX",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a973b);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CXX",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a9723);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CXX",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a970b);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CXX",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a9b1b);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CXX",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a6f92);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"C",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a9b1b);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"C",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4f95f3);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"C",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a991b);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CUDA",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a970b);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CUDA",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a9b1b);
        std::__cxx11::string::~string((string *)&standard);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&standard,"CUDA",(allocator<char> *)&optVec);
        pvVar7 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                               ::langStdMap_abi_cxx11_,&standard);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar7,(char (*) [3])0x4a6f92);
        std::__cxx11::string::~string((string *)&standard);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&standard,pcVar5,(allocator<char> *)&optVec);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_,lang);
      __rhs = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pmVar8->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (pmVar8->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&standard);
      pbVar1 = (pmVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (__rhs._M_current == pbVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_3,lang,"_STANDARD is set to invalid value \'");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_3,&standard);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&optVec,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &optVec_1,"\'");
        std::__cxx11::string::~string((string *)&optVec_1);
        std::__cxx11::string::~string((string *)&optVec_3);
        this_00 = this->GlobalGenerator->CMakeInstance;
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&optVec_1);
        cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&optVec,(cmListFileBacktrace *)&optVec_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &optVec_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
LAB_001d8136:
        std::__cxx11::string::~string((string *)&optVec);
      }
      else {
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                          ((pmVar8->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,pbVar1,&defaultStd);
        if (_Var9._M_current ==
            (pmVar8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(&local_258,"CMAKE_",lang);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_3,&local_258,"_STANDARD_DEFAULT is set to invalid value \'");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,defaultStd,&local_289);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_3,&local_210);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&optVec_1,"\'");
          std::__cxx11::string::~string((string *)&optVec_1);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&optVec_3);
          std::__cxx11::string::~string((string *)&local_258);
          IssueMessage(this,INTERNAL_ERROR,(string *)&optVec);
          goto LAB_001d8136;
        }
        if (_Var9._M_current <= __rhs._M_current) {
          std::operator+(&local_210,"CMAKE_",lang);
          std::operator+(&local_258,&local_210,__rhs._M_current);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_3,&local_258,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_3,&type);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&optVec_1,"_COMPILE_OPTION");
          std::__cxx11::string::~string((string *)&optVec_1);
          std::__cxx11::string::~string((string *)&optVec_3);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_210);
          pcVar6 = cmTarget::GetMakefile(target->Target);
          psVar11 = cmMakefile::GetRequiredDefinition(pcVar6,(string *)&optVec);
          optVec_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          optVec_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          optVec_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument(psVar11,&optVec_1,false);
          pbVar1 = optVec_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar13 = optVec_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
              pbVar13 = pbVar13 + 1) {
            (*this->_vptr_cmLocalGenerator[8])(this,flags,pbVar13);
          }
          this_01 = &optVec_1;
LAB_001d8131:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_01);
          goto LAB_001d8136;
        }
        local_1f0 = (_Base_ptr)_Var9;
        for (; __rhs._M_current < local_1f0; __rhs._M_current = __rhs._M_current + 1) {
          std::operator+(&local_210,"CMAKE_",lang);
          std::operator+(&local_258,&local_210,__rhs._M_current);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_3,&local_258,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec_3,&type);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &optVec,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&optVec_1,"_COMPILE_OPTION");
          std::__cxx11::string::~string((string *)&optVec_1);
          std::__cxx11::string::~string((string *)&optVec_3);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_210);
          pcVar6 = cmTarget::GetMakefile(target->Target);
          pcVar5 = cmMakefile::GetDefinition(pcVar6,(string *)&optVec);
          if (pcVar5 != (char *)0x0) {
            optVec_3.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            optVec_3.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            optVec_3.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&optVec_1,pcVar5,(allocator<char> *)&local_258);
            cmSystemTools::ExpandListArgument((string *)&optVec_1,&optVec_3,false);
            std::__cxx11::string::~string((string *)&optVec_1);
            pbVar1 = optVec_3.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar13 = optVec_3.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
                pbVar13 = pbVar13 + 1) {
              (*this->_vptr_cmLocalGenerator[8])(this,flags,pbVar13);
            }
            this_01 = &optVec_3;
            goto LAB_001d8131;
          }
          std::__cxx11::string::~string((string *)&optVec);
        }
      }
      psVar11 = &standard;
    }
    std::__cxx11::string::~string((string *)psVar11);
    psVar11 = &type;
  }
  std::__cxx11::string::~string((string *)psVar11);
LAB_001d815a:
  std::__cxx11::string::~string((string *)&stdProp);
  std::__cxx11::string::~string((string *)&extProp);
  return;
}

Assistant:

void cmLocalGenerator::AddCompilerRequirementFlag(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }
  const char* defaultStd =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_STANDARD_DEFAULT");
  if (!defaultStd || !*defaultStd) {
    // This compiler has no notion of language standard levels.
    return;
  }
  std::string extProp = lang + "_EXTENSIONS";
  bool ext = true;
  if (const char* extPropValue = target->GetProperty(extProp)) {
    if (cmSystemTools::IsOff(extPropValue)) {
      ext = false;
    }
  }
  std::string stdProp = lang + "_STANDARD";
  const char* standardProp = target->GetProperty(stdProp);
  if (!standardProp) {
    if (ext) {
      // No language standard is specified and extensions are not disabled.
      // Check if this compiler needs a flag to enable extensions.
      std::string const option_flag =
        "CMAKE_" + lang + "_EXTENSION_COMPILE_OPTION";
      if (const char* opt =
            target->Target->GetMakefile()->GetDefinition(option_flag)) {
        std::vector<std::string> optVec;
        cmSystemTools::ExpandListArgument(opt, optVec);
        for (std::string const& i : optVec) {
          this->AppendFlagEscape(flags, i);
        }
      }
    }
    return;
  }

  std::string const type = ext ? "EXTENSION" : "STANDARD";

  if (target->GetPropertyAsBool(lang + "_STANDARD_REQUIRED")) {
    std::string option_flag =
      "CMAKE_" + lang + standardProp + "_" + type + "_COMPILE_OPTION";

    const char* opt =
      target->Target->GetMakefile()->GetDefinition(option_flag);
    if (!opt) {
      std::ostringstream e;
      e << "Target \"" << target->GetName()
        << "\" requires the language "
           "dialect \""
        << lang << standardProp << "\" "
        << (ext ? "(with compiler extensions)" : "")
        << ", but CMake "
           "does not know the compile flags to use to enable it.";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    } else {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (std::string const& i : optVec) {
        this->AppendFlagEscape(flags, i);
      }
    }
    return;
  }

  static std::map<std::string, std::vector<std::string>> langStdMap;
  if (langStdMap.empty()) {
    // Maintain sorted order, most recent first.
    langStdMap["CXX"].emplace_back("20");
    langStdMap["CXX"].emplace_back("17");
    langStdMap["CXX"].emplace_back("14");
    langStdMap["CXX"].emplace_back("11");
    langStdMap["CXX"].emplace_back("98");

    langStdMap["C"].emplace_back("11");
    langStdMap["C"].emplace_back("99");
    langStdMap["C"].emplace_back("90");

    langStdMap["CUDA"].emplace_back("14");
    langStdMap["CUDA"].emplace_back("11");
    langStdMap["CUDA"].emplace_back("98");
  }

  std::string standard(standardProp);

  std::vector<std::string>& stds = langStdMap[lang];

  std::vector<std::string>::const_iterator stdIt =
    std::find(stds.begin(), stds.end(), standard);
  if (stdIt == stds.end()) {
    std::string e =
      lang + "_STANDARD is set to invalid value '" + standard + "'";
    this->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e, target->GetBacktrace());
    return;
  }

  std::vector<std::string>::const_iterator defaultStdIt =
    std::find(stds.begin(), stds.end(), defaultStd);
  if (defaultStdIt == stds.end()) {
    std::string e = "CMAKE_" + lang +
      "_STANDARD_DEFAULT is set to invalid value '" + std::string(defaultStd) +
      "'";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e);
    return;
  }

  // If the standard requested is older than the compiler's default
  // then we need to use a flag to change it.  The comparison is
  // greater-or-equal because the standards are stored in backward
  // chronological order.
  if (stdIt >= defaultStdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    std::string const& opt =
      target->Target->GetMakefile()->GetRequiredDefinition(option_flag);
    std::vector<std::string> optVec;
    cmSystemTools::ExpandListArgument(opt, optVec);
    for (std::string const& i : optVec) {
      this->AppendFlagEscape(flags, i);
    }
    return;
  }

  // The standard requested is at least as new as the compiler's default,
  // and the standard request is not required.  Decay to the newest standard
  // for which a flag is defined.
  for (; stdIt < defaultStdIt; ++stdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    if (const char* opt =
          target->Target->GetMakefile()->GetDefinition(option_flag)) {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (std::string const& i : optVec) {
        this->AppendFlagEscape(flags, i);
      }
      return;
    }
  }
}